

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadRaw(CodedInputStream *this,void *buffer,int size)

{
  bool bVar1;
  int amount;
  int in_EDX;
  void *in_RSI;
  CodedInputStream *in_RDI;
  int current_buffer_size;
  CodedInputStream *in_stack_000000a8;
  int local_1c;
  void *local_18;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  do {
    amount = BufferSize(in_RDI);
    if (local_1c <= amount) {
      memcpy(local_18,in_RDI->buffer_,(long)local_1c);
      Advance(in_RDI,local_1c);
      return true;
    }
    memcpy(local_18,in_RDI->buffer_,(long)amount);
    local_18 = (void *)((long)local_18 + (long)amount);
    local_1c = local_1c - amount;
    Advance(in_RDI,amount);
    bVar1 = Refresh(in_stack_000000a8);
  } while (bVar1);
  return false;
}

Assistant:

bool CodedInputStream::ReadRaw(void* buffer, int size) {
  int current_buffer_size;
  while ((current_buffer_size = BufferSize()) < size) {
    // Reading past end of buffer.  Copy what we have, then refresh.
    memcpy(buffer, buffer_, current_buffer_size);
    buffer = reinterpret_cast<uint8*>(buffer) + current_buffer_size;
    size -= current_buffer_size;
    Advance(current_buffer_size);
    if (!Refresh()) return false;
  }

  memcpy(buffer, buffer_, size);
  Advance(size);

  return true;
}